

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_xattr.c
# Opt level: O1

int fwrite_xattr(CURL *curl,int fd)

{
  bool bVar1;
  char *__value;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  size_t __size;
  long lVar6;
  char *__name;
  char *value;
  char *local_50;
  int local_44;
  CURL *local_40;
  char *local_38;
  
  __name = "user.xdg.referrer.url";
  lVar6 = 0x10;
  local_44 = fd;
  local_40 = curl;
  while( true ) {
    local_50 = (char *)0x0;
    iVar3 = *(int *)(&UNK_0012dd48 + lVar6);
    iVar2 = curl_easy_getinfo(local_40,iVar3,&local_50);
    iVar4 = 0;
    if ((iVar2 == 0) && (local_50 != (char *)0x0)) {
      iVar4 = 0;
      bVar1 = false;
      if (iVar3 == 0x100001) {
        lVar5 = curl_url();
        if ((((lVar5 == 0) || (iVar3 = curl_url_set(lVar5,0,local_50,0), iVar3 != 0)) ||
            (iVar3 = curl_url_set(lVar5,2,0,0), iVar3 != 0)) ||
           ((iVar3 = curl_url_set(lVar5,3,0,0), iVar3 != 0 ||
            (iVar3 = curl_url_get(lVar5,0,&local_38), iVar3 != 0)))) {
          curl_url_cleanup(lVar5);
          bVar1 = false;
        }
        else {
          curl_url_cleanup(lVar5);
          local_50 = local_38;
          bVar1 = true;
        }
      }
      __value = local_50;
      if (local_50 != (char *)0x0) {
        __size = strlen(local_50);
        iVar4 = fsetxattr(local_44,__name,__value,__size,0);
        if (bVar1) {
          curl_free(local_50);
        }
      }
    }
    if (iVar4 != 0) break;
    __name = *(char **)((long)&mappings[0].attr + lVar6);
    lVar6 = lVar6 + 0x10;
    if (lVar6 == 0x40) {
      return 0;
    }
  }
  return iVar4;
}

Assistant:

int fwrite_xattr(CURL *curl, int fd)
{
  int i = 0;
  int err = 0;

  /* loop through all xattr-curlinfo pairs and abort on a set error */
  while(err == 0 && mappings[i].attr != NULL) {
    char *value = NULL;
    CURLcode result = curl_easy_getinfo(curl, mappings[i].info, &value);
    if(!result && value) {
      bool freeptr = FALSE;
      if(CURLINFO_EFFECTIVE_URL == mappings[i].info)
        freeptr = stripcredentials(&value);
      if(value) {
#ifdef HAVE_FSETXATTR_6
        err = fsetxattr(fd, mappings[i].attr, value, strlen(value), 0, 0);
#elif defined(HAVE_FSETXATTR_5)
        err = fsetxattr(fd, mappings[i].attr, value, strlen(value), 0);
#elif defined(__FreeBSD_version)
        {
          ssize_t rc = extattr_set_fd(fd, EXTATTR_NAMESPACE_USER,
                                      mappings[i].attr, value, strlen(value));
          /* FreeBSD's extattr_set_fd returns the length of the extended
             attribute */
          err = (rc < 0 ? -1 : 0);
        }
#endif
        if(freeptr)
          curl_free(value);
      }
    }
    i++;
  }

  return err;
}